

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O2

void __thiscall jsonnet::internal::CompilerPass::visit(CompilerPass *this,DesugaredObject *ast)

{
  pointer pFVar1;
  _List_node_base *p_Var2;
  Field *field;
  pointer pFVar3;
  AST *assert;
  size_t local_30;
  
  p_Var2 = (_List_node_base *)&ast->asserts;
  while (p_Var2 = (((_List_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>
                     *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var2 != (_List_node_base *)&ast->asserts) {
    local_30 = (size_t)p_Var2[1]._M_next;
    (*this->_vptr_CompilerPass[6])(this,&local_30);
  }
  pFVar1 = (ast->fields).
           super__Vector_base<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pFVar3 = (ast->fields).
                super__Vector_base<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>
                ._M_impl.super__Vector_impl_data._M_start; pFVar3 != pFVar1; pFVar3 = pFVar3 + 1) {
    (*this->_vptr_CompilerPass[6])(this,&pFVar3->name);
    (*this->_vptr_CompilerPass[6])(this,&pFVar3->body);
  }
  return;
}

Assistant:

void CompilerPass::visit(DesugaredObject *ast)
{
    for (AST *assert : ast->asserts) {
        expr(assert);
    }
    for (auto &field : ast->fields) {
        expr(field.name);
        expr(field.body);
    }
}